

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-paint.c
# Opt level: O3

plutovg_paint_t *
plutovg_paint_create_linear_gradient
          (float x1,float y1,float x2,float y2,plutovg_spread_method_t spread,
          plutovg_gradient_stop_t *stops,int nstops,plutovg_matrix_t *matrix)

{
  plutovg_gradient_paint_t *ppVar1;
  
  ppVar1 = plutovg_gradient_create(PLUTOVG_GRADIENT_TYPE_LINEAR,spread,stops,nstops,matrix);
  ppVar1->values[0] = x1;
  ppVar1->values[1] = y1;
  ppVar1->values[2] = x2;
  ppVar1->values[3] = y2;
  return &ppVar1->base;
}

Assistant:

plutovg_paint_t* plutovg_paint_create_linear_gradient(float x1, float y1, float x2, float y2, plutovg_spread_method_t spread, const plutovg_gradient_stop_t* stops, int nstops, const plutovg_matrix_t* matrix)
{
    plutovg_gradient_paint_t* gradient = plutovg_gradient_create(PLUTOVG_GRADIENT_TYPE_LINEAR, spread, stops, nstops, matrix);
    gradient->values[0] = x1;
    gradient->values[1] = y1;
    gradient->values[2] = x2;
    gradient->values[3] = y2;
    return &gradient->base;
}